

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.h
# Opt level: O3

bool Imath_2_5::extractAndRemoveScalingAndShear<float>
               (Matrix33<float> *mat,Vec2<float> *scl,float *shr,bool exc)

{
  float *scl_00;
  undefined1 auVar1 [16];
  bool bVar2;
  bool bVar3;
  Vec2<float> *pVVar4;
  bool bVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  float fVar12;
  float fVar13;
  float fVar14;
  Vec2<float> VVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float fVar18;
  float local_5c;
  Vec2<float> local_58;
  Vec2<float> aVStack_50 [2];
  float *local_40;
  Vec2<float> *local_38;
  
  local_58.x = *(float *)((long)(mat->x + 0) + 0);
  local_58.y = *(float *)((long)(mat->x + 0) + 4);
  aVStack_50[0] = *(Vec2<float> *)(mat->x + 1);
  local_5c = 0.0;
  pVVar4 = &local_58;
  bVar3 = true;
  do {
    bVar2 = bVar3;
    lVar6 = 0;
    bVar3 = true;
    fVar14 = local_5c;
    do {
      bVar5 = bVar3;
      local_5c = (&pVVar4->x)[lVar6];
      if (local_5c <= -local_5c) {
        local_5c = -local_5c;
      }
      if (local_5c <= fVar14) {
        local_5c = fVar14;
      }
      lVar6 = 1;
      bVar3 = false;
      fVar14 = local_5c;
    } while (bVar5);
    pVVar4 = aVStack_50;
    bVar3 = false;
  } while (bVar2);
  if ((local_5c != 0.0) || (NAN(local_5c))) {
    pVVar4 = &local_58;
    bVar3 = true;
    local_40 = shr;
    local_38 = scl;
    do {
      bVar2 = bVar3;
      bVar3 = checkForZeroScaleInRow<float>(&local_5c,pVVar4,exc);
      if (!bVar3) {
        return false;
      }
      auVar9._8_8_ = 0;
      auVar9._0_4_ = pVVar4->x;
      auVar9._4_4_ = pVVar4->y;
      auVar16._4_4_ = local_5c;
      auVar16._0_4_ = local_5c;
      auVar16._8_8_ = 0;
      auVar9 = divps(auVar9,auVar16);
      *pVVar4 = auVar9._0_8_;
      scl = local_38;
      shr = local_40;
      pVVar4 = aVStack_50;
      bVar3 = false;
    } while (bVar2);
  }
  fVar14 = local_58.x;
  fVar18 = local_58.y;
  fVar12 = fVar14 * fVar14 + fVar18 * fVar18;
  if (2.3509887e-38 <= fVar12) {
    fVar12 = SQRT(fVar12);
  }
  else {
    uVar7 = -(uint)(fVar14 < -fVar14);
    uVar8 = -(uint)(fVar18 < -fVar18);
    fVar13 = (float)(~uVar7 & (uint)fVar14 | (uint)-fVar14 & uVar7);
    fVar18 = (float)(~uVar8 & (uint)fVar18 | (uint)-fVar18 & uVar8);
    fVar14 = fVar18;
    if (fVar18 <= fVar13) {
      fVar14 = fVar13;
    }
    fVar12 = 0.0;
    if ((fVar14 != 0.0) || (NAN(fVar14))) {
      fVar12 = SQRT((fVar13 / fVar14) * (fVar13 / fVar14) + (fVar18 / fVar14) * (fVar18 / fVar14)) *
               fVar14;
    }
  }
  scl->x = fVar12;
  bVar3 = checkForZeroScaleInRow<float>(&scl->x,&local_58,exc);
  if (bVar3) {
    fVar14 = scl->x;
    auVar10._4_4_ = fVar14;
    auVar10._0_4_ = fVar14;
    auVar10._8_4_ = fVar14;
    auVar10._12_4_ = fVar14;
    auVar17._8_8_ = 0;
    auVar17._0_4_ = local_58.x;
    auVar17._4_4_ = local_58.y;
    auVar9 = divps(auVar17,auVar10);
    fVar14 = aVStack_50[0].y;
    fVar18 = auVar9._0_4_ * aVStack_50[0].x + auVar9._4_4_ * fVar14;
    *shr = fVar18;
    aVStack_50[0].x = aVStack_50[0].x - fVar18 * auVar9._0_4_;
    aVStack_50[0].y = fVar14 - fVar18 * auVar9._4_4_;
    local_58 = auVar9._0_8_;
    fVar14 = aVStack_50[0].x * aVStack_50[0].x + aVStack_50[0].y * aVStack_50[0].y;
    if (2.3509887e-38 <= fVar14) {
      fVar14 = SQRT(fVar14);
    }
    else {
      uVar7 = -(uint)(aVStack_50[0].x < -aVStack_50[0].x);
      uVar8 = -(uint)(aVStack_50[0].y < -aVStack_50[0].y);
      fVar12 = (float)(~uVar7 & (uint)aVStack_50[0].x | (uint)-aVStack_50[0].x & uVar7);
      fVar13 = (float)(~uVar8 & (uint)aVStack_50[0].y | (uint)-aVStack_50[0].y & uVar8);
      fVar18 = fVar13;
      if (fVar13 <= fVar12) {
        fVar18 = fVar12;
      }
      fVar14 = 0.0;
      if ((fVar18 != 0.0) || (NAN(fVar18))) {
        fVar14 = SQRT((fVar12 / fVar18) * (fVar12 / fVar18) + (fVar13 / fVar18) * (fVar13 / fVar18))
                 * fVar18;
      }
    }
    scl_00 = &scl->y;
    scl->y = fVar14;
    bVar3 = checkForZeroScaleInRow<float>(scl_00,aVStack_50,exc);
    if (bVar3) {
      fVar14 = *scl_00;
      auVar11._8_8_ = 0;
      auVar11._0_4_ = aVStack_50[0].x;
      auVar11._4_4_ = aVStack_50[0].y;
      auVar1._4_4_ = fVar14;
      auVar1._0_4_ = fVar14;
      auVar1._8_4_ = fVar14;
      auVar1._12_4_ = fVar14;
      auVar9 = divps(auVar11,auVar1);
      aVStack_50[0] = auVar9._0_8_;
      *shr = *shr / fVar14;
      if (auVar9._4_4_ * local_58.x - local_58.y * auVar9._0_4_ < 0.0) {
        aVStack_50[0] = (Vec2<float>)((ulong)aVStack_50[0] ^ 0x8000000080000000);
        *scl_00 = -*scl_00;
        *shr = -*shr;
      }
      *(float *)((long)(mat->x + 0) + 0) = local_58.x;
      *(float *)((long)(mat->x + 0) + 4) = local_58.y;
      *(Vec2<float> *)(mat->x + 1) = aVStack_50[0];
      VVar15.x = local_5c * (*scl).x;
      VVar15.y = local_5c * (*scl).y;
      *scl = VVar15;
      return true;
    }
  }
  return false;
}

Assistant:

bool
extractAndRemoveScalingAndShear (Matrix33<T> &mat, 
				 Vec2<T> &scl, T &shr, bool exc)
{
    Vec2<T> row[2];

    row[0] = Vec2<T> (mat[0][0], mat[0][1]);
    row[1] = Vec2<T> (mat[1][0], mat[1][1]);
    
    T maxVal = 0;
    for (int i=0; i < 2; i++)
	for (int j=0; j < 2; j++)
	    if (IMATH_INTERNAL_NAMESPACE::abs (row[i][j]) > maxVal)
		maxVal = IMATH_INTERNAL_NAMESPACE::abs (row[i][j]);

    //
    // We normalize the 2x2 matrix here.
    // It was noticed that this can improve numerical stability significantly,
    // especially when many of the upper 2x2 matrix's coefficients are very
    // close to zero; we correct for this step at the end by multiplying the 
    // scaling factors by maxVal at the end (shear and rotation are not 
    // affected by the normalization).

    if (maxVal != 0)
    {
	for (int i=0; i < 2; i++)
	    if (! checkForZeroScaleInRow (maxVal, row[i], exc))
		return false;
	    else
		row[i] /= maxVal;
    }

    // Compute X scale factor. 
    scl.x = row[0].length ();
    if (! checkForZeroScaleInRow (scl.x, row[0], exc))
	return false;

    // Normalize first row.
    row[0] /= scl.x;

    // An XY shear factor will shear the X coord. as the Y coord. changes.
    // There are 2 combinations (XY, YX), although we only extract the XY 
    // shear factor because we can effect the an YX shear factor by 
    // shearing in XY combined with rotations and scales.
    //
    // shear matrix <   1,  YX,  0,
    //                 XY,   1,  0,
    //                  0,   0,  1 >

    // Compute XY shear factor and make 2nd row orthogonal to 1st.
    shr     = row[0].dot (row[1]);
    row[1] -= shr * row[0];

    // Now, compute Y scale.
    scl.y = row[1].length ();
    if (! checkForZeroScaleInRow (scl.y, row[1], exc))
	return false;

    // Normalize 2nd row and correct the XY shear factor for Y scaling.
    row[1] /= scl.y; 
    shr    /= scl.y;

    // At this point, the upper 2x2 matrix in mat is orthonormal.
    // Check for a coordinate system flip. If the determinant
    // is -1, then flip the rotation matrix and adjust the scale(Y) 
    // and shear(XY) factors to compensate.
    if (row[0][0] * row[1][1] - row[0][1] * row[1][0] < 0)
    {
	row[1][0] *= -1;
	row[1][1] *= -1;
	scl[1] *= -1;
	shr *= -1;
    }

    // Copy over the orthonormal rows into the returned matrix.
    // The upper 2x2 matrix in mat is now a rotation matrix.
    for (int i=0; i < 2; i++)
    {
	mat[i][0] = row[i][0]; 
	mat[i][1] = row[i][1]; 
    }

    scl *= maxVal;

    return true;
}